

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

ostream * __thiscall wasm::PrintSExpression::printHeapTypeName(PrintSExpression *this,HeapType type)

{
  ostream *poVar1;
  TypeNames local_60;
  
  if (type.id < 0x7d) {
    poVar1 = wasm::operator<<(this->o,type);
    return poVar1;
  }
  TypePrinter::getNames(&local_60,&this->typePrinter,type);
  poVar1 = Name::print(&local_60.name,this->o);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_60.fieldNames._M_h);
  return poVar1;
}

Assistant:

std::ostream& printHeapTypeName(HeapType type) {
    if (type.isBasic()) {
      return o << type;
    }
    return typePrinter.getNames(type).name.print(o);
  }